

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Phi(PortalImageInfiniteLight *this,SampledWavelengths *lambda)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  RGB *pRVar5;
  long lVar6;
  int c;
  int c_00;
  ulong uVar7;
  Point2i p;
  Float FVar8;
  undefined1 auVar13 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  RGB RVar18;
  SampledSpectrum SVar19;
  Float duv_dw;
  undefined1 local_d8 [8];
  undefined1 local_d0 [16];
  long local_c0;
  SampledWavelengths *local_b8;
  ulong local_b0;
  RGBColorSpace *local_a8;
  RGB local_a0;
  WrapMode2D local_90;
  SampledSpectrum sumL;
  undefined1 local_68 [16];
  SampledSpectrum local_50;
  SampledSpectrum local_40;
  undefined1 auVar17 [56];
  
  local_b8 = lambda;
  SampledSpectrum::SampledSpectrum(&sumL,0.0);
  TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  lVar6 = 0;
  local_d0._8_8_ = this;
  while (uVar3 = local_d0._8_8_, auVar13 = in_ZMM1._8_56_, lVar6 < (long)TVar4 >> 0x20) {
    local_b0 = lVar6 << 0x20;
    local_c0 = lVar6;
    for (uVar7 = 0; (long)uVar7 < (long)TVar4.x; uVar7 = uVar7 + 1) {
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      local_d0._0_4_ = 0.0;
      p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_b0 | uVar7);
      for (c_00 = 0; uVar3 = local_d0._8_8_, c_00 != 3; c_00 = c_00 + 1) {
        WrapMode2D::WrapMode2D(&local_90,Clamp);
        FVar8 = Image::GetChannel(&this->image,p,c_00,local_90);
        pRVar5 = (RGB *)local_d8;
        if ((c_00 != 0) && (pRVar5 = (RGB *)(local_d8 + 4), c_00 != 1)) {
          pRVar5 = (RGB *)local_d0;
        }
        pRVar5->r = FVar8;
      }
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           (((Image *)(local_d0._8_8_ + 0xf0))->resolution).super_Tuple2<pbrt::Point2,_int>;
      auVar2 = vinsertps_avx(ZEXT416((uint)((float)(int)uVar7 + 0.5)),
                             ZEXT416((uint)((float)(int)lVar6 + 0.5)),0x10);
      auVar14 = vcvtdq2ps_avx(auVar14);
      auVar17 = ZEXT856(auVar14._8_8_);
      auVar14 = vdivps_avx(auVar2,auVar14);
      auVar13 = ZEXT856(auVar14._8_8_);
      RenderFromImage((PortalImageInfiniteLight *)local_d0._8_8_,(Point2f)auVar14._0_8_,&duv_dw);
      local_a8 = *(RGBColorSpace **)(uVar3 + 0x1c8);
      RVar18 = ClampZero((RGB *)local_d8);
      local_a0.b = RVar18.b;
      auVar9._0_8_ = RVar18._0_8_;
      auVar9._8_56_ = auVar13;
      local_a0._0_8_ = vmovlps_avx(auVar9._0_16_);
      RGBIlluminantSpectrum::RGBIlluminantSpectrum
                ((RGBIlluminantSpectrum *)local_68,local_a8,&local_a0);
      SVar19 = RGBIlluminantSpectrum::Sample((RGBIlluminantSpectrum *)local_68,local_b8);
      auVar15._0_8_ = SVar19.values.values._8_8_;
      auVar15._8_56_ = auVar17;
      auVar10._0_8_ = SVar19.values.values._0_8_;
      auVar10._8_56_ = auVar13;
      local_50.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar15._0_16_);
      auVar13 = (undefined1  [56])0x0;
      SVar19 = SampledSpectrum::operator/(&local_50,duv_dw);
      in_ZMM1._0_8_ = SVar19.values.values._8_8_;
      in_ZMM1._8_56_ = auVar17;
      auVar11._0_8_ = SVar19.values.values._0_8_;
      auVar11._8_56_ = auVar13;
      local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,in_ZMM1._0_16_);
      SampledSpectrum::operator+=(&sumL,&local_40);
      TVar4 = (((Image *)(uVar3 + 0xf0))->resolution).super_Tuple2<pbrt::Point2,_int>;
    }
    lVar6 = local_c0 + 1;
  }
  fVar1 = *(Float *)(local_d0._8_8_ + 0x1d0);
  FVar8 = Area((PortalImageInfiniteLight *)local_d0._8_8_);
  auVar17 = (undefined1  [56])0x0;
  SVar19 = SampledSpectrum::operator*(&sumL,FVar8 * fVar1);
  auVar16._0_8_ = SVar19.values.values._8_8_;
  auVar16._8_56_ = auVar13;
  auVar12._0_8_ = SVar19.values.values._0_8_;
  auVar12._8_56_ = auVar17;
  local_68 = vmovlhps_avx(auVar12._0_16_,auVar16._0_16_);
  TVar4 = (((Image *)(uVar3 + 0xf0))->resolution).super_Tuple2<pbrt::Point2,_int>;
  SVar19 = SampledSpectrum::operator/((SampledSpectrum *)local_68,(float)(TVar4.y * TVar4.x));
  return (array<float,_4>)(array<float,_4>)SVar19;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're really computing fluence, then converting to power, for what
    // that's worth..
    SampledSpectrum sumL(0.);

    for (int y = 0; y < image.Resolution().y; ++y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({x, y}, c);

            Point2f st((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);
            Float duv_dw;
            (void)RenderFromImage(st, &duv_dw);

            sumL +=
                RGBIlluminantSpectrum(*imageColorSpace, ClampZero(rgb)).Sample(lambda) /
                duv_dw;
        }
    }

    return scale * Area() * sumL / (image.Resolution().x * image.Resolution().y);
}